

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xpath_deref(lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,lys_module *param_4,
               lyxp_set *set,int options)

{
  lyxp_set_type lVar1;
  uint uVar2;
  lyxp_set *plVar3;
  lys_node *plVar4;
  long lVar5;
  undefined8 uVar6;
  int iVar7;
  
  plVar3 = *args;
  lVar1 = plVar3->type;
  if ((ulong)lVar1 < 3) {
    if ((options & 0x1cU) == 0) {
      iVar7 = 0;
      lyxp_set_cast(set,LYXP_SET_EMPTY,cur_node,param_4,options);
      if ((*args)->type != LYXP_SET_EMPTY) {
        plVar4 = (((*args)->val).snodes)->snode;
        if (((plVar4->name[0x38] & 0xcU) != 0) &&
           ((*(uint *)(plVar4->name + 0x80) & 0xfffffffe) == 8)) {
          if (((ulong)plVar4->parent & 0xc0) == 0) {
            iVar7 = 0;
            set_insert_node(set,*(void **)&plVar4->nodetype,0,LYXP_NODE_ELEM,0);
          }
          else {
            iVar7 = -1;
            ly_vlog(LYE_SPEC,LY_VLOG_LYD,plVar4,
                    "Trying to dereference an unresolved leafref or instance-identifier.");
          }
        }
      }
    }
    else {
      if (lVar1 != LYXP_SET_SNODE_SET) {
        __assert_fail("args[0]->type == LYXP_SET_SNODE_SET",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                      ,0xb2a,
                      "int xpath_deref(struct lyxp_set **, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                     );
      }
      uVar2 = set->used;
      if ((ulong)uVar2 != 0) {
        lVar5 = 0;
        do {
          if (*(int *)((long)&((set->val).nodes)->pos + lVar5) == 1) {
            *(undefined4 *)((long)&((set->val).nodes)->pos + lVar5) = 0;
          }
          lVar5 = lVar5 + 0x10;
        } while ((ulong)uVar2 << 4 != lVar5);
      }
      plVar4 = ((plVar3->val).snodes)->snode;
      if (((plVar4->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
         (iVar7._0_2_ = plVar4[1].flags, iVar7._2_1_ = plVar4[1].ext_size,
         iVar7._3_1_ = plVar4[1].iffeature_size, iVar7 == 9)) {
        if ((*(long *)&plVar4[1].nodetype == 0) || (plVar4[1].parent == (lys_node *)0x0)) {
          __assert_fail("sleaf->type.info.lref.path && sleaf->type.info.lref.target",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                        ,0xb2f,
                        "int xpath_deref(struct lyxp_set **, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                       );
        }
        set_insert_node(set,plVar4[1].parent,0,LYXP_NODE_ELEM,0);
      }
      set_snode_insert_node(set,(lys_node *)cur_node,LYXP_NODE_ELEM);
      iVar7 = 0;
    }
  }
  else {
    if (lVar1 < (LYXP_SET_NUMBER|LYXP_SET_SNODE_SET)) {
      uVar6 = *(undefined8 *)(&DAT_001afd20 + (ulong)lVar1 * 8);
    }
    else {
      uVar6 = 0;
    }
    ly_vlog(LYE_XPATH_INARGTYPE,LY_VLOG_NONE,(void *)0x0,1,uVar6,"deref(node-set)");
    iVar7 = -1;
  }
  return iVar7;
}

Assistant:

static int
xpath_deref(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node, struct lys_module *local_mod,
            struct lyxp_set *set, int options)
{
    struct lyd_node_leaf_list *leaf;
    struct lys_node_leaf *sleaf;

    if ((args[0]->type != LYXP_SET_NODE_SET) && (args[0]->type != LYXP_SET_SNODE_SET)
            && (args[0]->type != LYXP_SET_EMPTY)) {
        LOGVAL(LYE_XPATH_INARGTYPE, LY_VLOG_NONE, NULL, 1, print_set_type(args[0]), "deref(node-set)");
        return -1;
    }

    if (options & LYXP_SNODE_ALL) {
        assert(args[0]->type == LYXP_SET_SNODE_SET);
        set_snode_clear_ctx(set);

        sleaf = (struct lys_node_leaf *)args[0]->val.snodes[0].snode;
        if ((sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST)) && (sleaf->type.base == LY_TYPE_LEAFREF)) {
            assert(sleaf->type.info.lref.path && sleaf->type.info.lref.target);
            set_insert_node(set, sleaf->type.info.lref.target, 0, LYXP_NODE_ELEM, 0);
        }
        set_snode_insert_node(set, (struct lys_node *)cur_node, LYXP_NODE_ELEM);
    } else {
        lyxp_set_cast(set, LYXP_SET_EMPTY, cur_node, local_mod, options);
        if (args[0]->type != LYXP_SET_EMPTY) {
            leaf = (struct lyd_node_leaf_list *)args[0]->val.nodes[0].node;
            sleaf = (struct lys_node_leaf *)leaf->schema;
            if ((sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))
                    && ((sleaf->type.base == LY_TYPE_LEAFREF) || (sleaf->type.base == LY_TYPE_INST))) {
                if (leaf->value_type & (LY_TYPE_LEAFREF_UNRES | LY_TYPE_INST_UNRES)) {
                    /* this is bad */
                    LOGVAL(LYE_SPEC, LY_VLOG_LYD, args[0]->val.nodes[0].node,
                           "Trying to dereference an unresolved leafref or instance-identifier.");
                    return -1;
                }
                /* works for both leafref and instid */
                set_insert_node(set, leaf->value.leafref, 0, LYXP_NODE_ELEM, 0);
            }
        }
    }

    return EXIT_SUCCESS;
}